

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExportDirWrapper.cpp
# Opt level: O1

char * __thiscall ExportEntryWrapper::getFuncName(ExportEntryWrapper *this)

{
  Executable *pEVar1;
  int iVar2;
  uint *puVar3;
  undefined4 extraout_var;
  ulong uVar4;
  
  puVar3 = (uint *)getFuncNameRvaPtr(this);
  if (puVar3 == (uint *)0x0) {
    uVar4 = 0xffffffffffffffff;
  }
  else {
    uVar4 = (ulong)*puVar3;
  }
  if (uVar4 != 0xffffffffffffffff) {
    pEVar1 = (this->super_ExeNodeWrapper).super_ExeElementWrapper.m_Exe;
    iVar2 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe])(pEVar1,uVar4,2,1,0);
    return (char *)CONCAT44(extraout_var,iVar2);
  }
  return (char *)0x0;
}

Assistant:

char* ExportEntryWrapper::getFuncName()
{
    uint64_t funcRva = getFuncNameRva();
    if (funcRva == INVALID_ADDR) return NULL;

    char* name = (char*) this->m_Exe->getContentAt(funcRva, Executable::RVA, 1);
    if (name == NULL) return NULL;
    //TODO.... verify
    return name;
}